

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O0

void __thiscall
PatchHandleArchipelago::handle_npc_set_uuid_on_reward
          (PatchHandleArchipelago *this,ROM *rom,RandomizerWorld *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  uint16_t value;
  uint32_t uVar1;
  Code *code;
  Code local_3e8;
  allocator<char> local_369;
  string local_368;
  uint32_t local_348;
  allocator<md::AddressRegister> local_341;
  uint32_t proc_addr;
  iterator local_330;
  size_type local_328;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_320;
  allocator<md::DataRegister> local_301;
  DataRegister local_300;
  iterator local_2f0;
  size_type local_2e8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_2e0;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  Register local_278;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  Param local_218 [2];
  DataRegister local_208;
  DataRegister local_1f8;
  DataRegister local_1e8;
  allocator<char> local_1d1;
  string local_1d0;
  AddressRegister local_1b0;
  DataRegister local_1a0;
  AddressRegister local_190;
  AddressWithIndex local_180;
  allocator<char> local_159;
  string local_158;
  DataRegister local_138;
  AddressRegister local_128;
  AddressWithIndex local_118;
  allocator<char> local_f1;
  string local_f0;
  AddressRegister local_d0 [2];
  DataRegister local_b0;
  undefined1 local_a0 [8];
  Code proc;
  uint32_t npc_addr_to_uuid_table_addr;
  RandomizerWorld *world_local;
  ROM *rom_local;
  PatchHandleArchipelago *this_local;
  
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       inject_npc_addr_to_uuid_table(rom,world);
  md::Code::Code((Code *)local_a0);
  md::DataRegister::DataRegister(&local_b0,'\a');
  md::Code::clrl((Code *)local_a0,(Param *)&local_b0);
  uVar1 = proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  md::AddressRegister::AddressRegister(local_d0,'\x01');
  md::Code::lea((Code *)local_a0,uVar1,local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"loop",&local_f1);
  md::Code::label((Code *)local_a0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  md::AddressRegister::AddressRegister(&local_128,'\x01');
  md::DataRegister::DataRegister(&local_138,'\a');
  addr_<void>(&local_118,&local_128,&local_138,'\0',LONG);
  md::Code::cmpil((Code *)local_a0,0xffffffff,&local_118.super_Param);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"return",&local_159);
  md::Code::beq((Code *)local_a0,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  md::AddressRegister::AddressRegister(&local_190,'\x01');
  md::DataRegister::DataRegister(&local_1a0,'\a');
  addr_<void>(&local_180,&local_190,&local_1a0,'\0',LONG);
  md::AddressRegister::AddressRegister(&local_1b0,'\0');
  md::Code::cmpa((Code *)local_a0,&local_180.super_Param,&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"not_this_reward",&local_1d1);
  md::Code::bne((Code *)local_a0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  md::DataRegister::DataRegister(&local_1e8,'\a');
  md::Code::lsrw((Code *)local_a0,'\x02',&local_1e8);
  value = ItemSourceReward::base_reward_uuid();
  md::DataRegister::DataRegister(&local_1f8,'\a');
  md::Code::addiw((Code *)local_a0,value,(Param *)&local_1f8);
  md::DataRegister::DataRegister(&local_208,'\a');
  addr_<void>((uint32_t)local_218,0xff0026);
  md::Code::movew((Code *)local_a0,(Param *)&local_208,local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"return",&local_239);
  md::Code::bra((Code *)local_a0,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"not_this_reward",&local_261);
  md::Code::label((Code *)local_a0,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  md::DataRegister::DataRegister((DataRegister *)&local_278,'\a');
  md::Code::addqb((Code *)local_a0,'\x04',&local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"loop",&local_299);
  md::Code::bra((Code *)local_a0,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"return",&local_2c1);
  md::Code::label((Code *)local_a0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  md::DataRegister::DataRegister(&local_300,'\0');
  local_2f0 = &local_300;
  local_2e8 = 1;
  std::allocator<md::DataRegister>::allocator(&local_301);
  __l_00._M_len = local_2e8;
  __l_00._M_array = local_2f0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_2e0,__l_00,&local_301);
  md::AddressRegister::AddressRegister((AddressRegister *)&proc_addr,'\x01');
  local_330 = (iterator)&proc_addr;
  local_328 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_341);
  __l._M_len = local_328;
  __l._M_array = local_330;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_320,__l,&local_341);
  md::Code::movem_from_stack((Code *)local_a0,&local_2e0,&local_320);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_320);
  std::allocator<md::AddressRegister>::~allocator(&local_341);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_2e0);
  std::allocator<md::DataRegister>::~allocator(&local_301);
  md::Code::rts((Code *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"",&local_369);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_a0,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  local_3e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_3e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_3e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e8._labels._M_t._M_impl._0_8_ = 0;
  local_3e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_3e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_3e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_3e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_348 = uVar1;
  md::Code::Code(&local_3e8);
  code = md::Code::jmp(&local_3e8,local_348);
  md::ROM::set_code(rom,0x28dde,code);
  md::Code::~Code(&local_3e8);
  md::Code::~Code((Code *)local_a0);
  return;
}

Assistant:

void handle_npc_set_uuid_on_reward(md::ROM& rom, RandomizerWorld& world)
    {
        // Inject a lookup table to determine the UUID of a NPC reward based on its address
        // This is injected at "inject_code" time since it needs for RemoveStoryDependency patch to execute its
        // own inject_code routine to have the correct address for the vanilla Red Jewel item source.
        uint32_t npc_addr_to_uuid_table_addr = inject_npc_addr_to_uuid_table(rom, world);

        md::Code proc;
        {
            proc.clrl(reg_D7);
            proc.lea(npc_addr_to_uuid_table_addr, reg_A1);
            proc.label("loop");
            {
                proc.cmpil(0xFFFFFFFF, addr_(reg_A1, reg_D7));
                proc.beq("return"); // We reached the end of the table, this reward is not handled, just skip it
                proc.cmpa(addr_(reg_A1, reg_D7), reg_A0);
                proc.bne("not_this_reward");
                {
                    proc.lsrw(2, reg_D7);
                    proc.addiw(ItemSourceReward::base_reward_uuid(), reg_D7);
                    proc.movew(reg_D7, addr_(ADDR_ARCHIPELAGO_CURRENT_LOCATION_UUID));
                    proc.bra("return");
                }
                proc.label("not_this_reward");
                proc.addqb(4, reg_D7);
                proc.bra("loop");
            }
        }
        proc.label("return");
        proc.movem_from_stack({ reg_D0 }, { reg_A1 });
        proc.rts();

        uint32_t proc_addr = rom.inject_code(proc);
        rom.set_code(0x28DDE, md::Code().jmp(proc_addr));
    }